

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocaltime.cpp
# Opt level: O0

tm * anon_unknown.dwarf_362fcb::matchYearMonth(tm when,tm *base)

{
  long lVar1;
  int iVar2;
  R_conflict4 RVar3;
  long in_RSI;
  tm *in_RDI;
  long in_FS_OFFSET;
  int in_stack_00000008;
  int in_stack_0000000c;
  int in_stack_00000010;
  int in_stack_00000014;
  int in_stack_00000018;
  int in_stack_0000001c;
  int month;
  int year;
  R_conflict4 yearMon_1;
  R_conflict4 yearMon;
  int in_stack_ffffffffffffffbc;
  tm *ptVar4;
  int local_28;
  int local_24;
  int local_18;
  int local_10;
  int iStack_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  for (; *(int *)(in_RSI + 0x14) < in_stack_0000001c; in_stack_0000001c = in_stack_0000001c + -1) {
    in_stack_00000018 = in_stack_00000018 + 0xc;
  }
  for (; local_28 = in_stack_ffffffffffffffbc, ptVar4 = in_RDI,
      in_stack_0000001c < *(int *)(in_RSI + 0x14); in_stack_0000001c = in_stack_0000001c + 1) {
    in_stack_00000018 = in_stack_00000018 + -0xc;
  }
  for (; *(int *)(in_RSI + 0x10) < in_stack_00000018; in_stack_00000018 = in_stack_00000018 + -1) {
    RVar3 = QRoundingDown::qDivMod<12U,_int,_true>(in_stack_00000018);
    local_10 = RVar3.quotient;
    local_24 = local_10;
    iStack_c = RVar3.remainder;
    local_28 = iStack_c;
    if (iStack_c == 0) {
      local_24 = local_10 + -1;
      local_28 = 0xc;
    }
    qYearFromTmYear(in_stack_0000001c + local_24);
    iVar2 = QGregorianCalendar::monthLength((int)ptVar4,local_28);
    in_stack_00000014 = iVar2 + in_stack_00000014;
  }
  for (; in_stack_00000018 < *(int *)(in_RSI + 0x10); in_stack_00000018 = in_stack_00000018 + 1) {
    RVar3 = QRoundingDown::qDivMod<12U,_int,_true>(in_stack_00000018);
    local_18 = RVar3.quotient;
    qYearFromTmYear(local_18 + in_stack_0000001c);
    iVar2 = QGregorianCalendar::monthLength((int)ptVar4,local_28);
    in_stack_00000014 = in_stack_00000014 - iVar2;
  }
  ptVar4->tm_zone = (char *)yearMon;
  *(tm **)&ptVar4->tm_isdst = base;
  *(int *)&ptVar4->tm_gmtoff = yearMon_1.quotient;
  *(int *)((long)&ptVar4->tm_gmtoff + 4) = yearMon_1.remainder;
  ptVar4->tm_mon = in_stack_00000018;
  ptVar4->tm_year = in_stack_0000001c;
  ptVar4->tm_wday = month;
  ptVar4->tm_yday = year;
  ptVar4->tm_sec = in_stack_00000008;
  ptVar4->tm_min = in_stack_0000000c;
  ptVar4->tm_hour = in_stack_00000010;
  ptVar4->tm_mday = in_stack_00000014;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

Q_DECL_COLD_FUNCTION
struct tm matchYearMonth(struct tm when, const struct tm &base)
{
    // Adjust *when to be a denormal representation of the same point in time
    // but with tm_year and tm_mon the same as base. In practice this will
    // represent an adjacent month, so don't worry too much about optimising for
    // any other case; we almost certainly run zero or one iteration of one of
    // the year loops then zero or one iteration of one of the month loops.
    while (when.tm_year > base.tm_year) {
        --when.tm_year;
        when.tm_mon += 12;
    }
    while (when.tm_year < base.tm_year) {
        ++when.tm_year;
        when.tm_mon -= 12;
    }
    Q_ASSERT(when.tm_year == base.tm_year);
    while (when.tm_mon > base.tm_mon) {
        const auto yearMon = QRoundingDown::qDivMod<12>(when.tm_mon);
        int year = yearMon.quotient;
        // We want the month before's Qt month number, which is the tm_mon mod 12:
        int month = yearMon.remainder;
        if (month == 0) {
            --year;
            month = 12;
        }
        year += when.tm_year;
        when.tm_mday += QGregorianCalendar::monthLength(month, qYearFromTmYear(year));
        --when.tm_mon;
    }
    while (when.tm_mon < base.tm_mon) {
        const auto yearMon = QRoundingDown::qDivMod<12>(when.tm_mon);
        // Qt month number is offset from tm_mon by one:
        when.tm_mday -= QGregorianCalendar::monthLength(
            yearMon.remainder + 1, qYearFromTmYear(yearMon.quotient + when.tm_year));
        ++when.tm_mon;
    }
    Q_ASSERT(when.tm_mon == base.tm_mon);
    return when;
}